

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

void __thiscall cmGlobalGenerator::Generate(cmGlobalGenerator *this)

{
  _Rb_tree_header *p_Var1;
  cmMakefile *this_00;
  cmake *pcVar2;
  bool bVar3;
  bool bVar4;
  pointer ppcVar5;
  _Rb_tree_node_base *p_Var6;
  ostream *poVar7;
  _Base_ptr p_Var8;
  PolicyID id;
  PolicyID id_00;
  ulong uVar9;
  ostringstream w;
  undefined1 local_1e8 [32];
  cmListFileBacktrace local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  (*this->_vptr_cmGlobalGenerator[0x2b])();
  ProcessEvaluationFiles(this);
  ppcVar5 = (this->LocalGenerators).
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->LocalGenerators).
      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppcVar5) {
    uVar9 = 0;
    do {
      this->CurrentConfigureMakefile = ppcVar5[uVar9]->Makefile;
      (*ppcVar5[uVar9]->_vptr_cmLocalGenerator[2])();
      this_00 = (this->LocalGenerators).
                super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
                super__Vector_impl_data._M_start[uVar9]->Makefile;
      local_1a8._0_8_ = local_1a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"CMAKE_SKIP_INSTALL_RULES","");
      bVar3 = cmMakefile::IsOn(this_00,(string *)local_1a8);
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if (!bVar3) {
        cmLocalGenerator::GenerateInstallRules
                  ((this->LocalGenerators).
                   super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar9]);
      }
      cmLocalGenerator::GenerateTestFiles
                ((this->LocalGenerators).
                 super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl
                 .super__Vector_impl_data._M_start[uVar9]);
      cmake::UpdateProgress
                (this->CMakeInstance,"Generating",
                 ((float)uVar9 + 1.0) /
                 (float)(ulong)((long)(this->LocalGenerators).
                                      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->LocalGenerators).
                                      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3));
      uVar9 = (ulong)((int)uVar9 + 1);
      ppcVar5 = (this->LocalGenerators).
                super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar9 < (ulong)((long)(this->LocalGenerators).
                                   super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppcVar5 >> 3))
    ;
  }
  this->CurrentConfigureMakefile = (cmMakefile *)0x0;
  GenerateCPackPropertiesFile(this);
  p_Var6 = (this->BuildExportSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    bVar3 = (_Rb_tree_header *)p_Var6 != &(this->BuildExportSets)._M_t._M_impl.super__Rb_tree_header
    ;
    if (!bVar3) {
LAB_0033a217:
      CheckRuleHashes(this);
      WriteSummary(this);
      if (this->ExtraGenerator != (cmExternalMakefileProjectGenerator *)0x0) {
        (*this->ExtraGenerator->_vptr_cmExternalMakefileProjectGenerator[4])();
      }
      if ((this->CMP0042WarnTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        cmPolicies::GetPolicyWarning_abi_cxx11_((string *)local_1e8,(cmPolicies *)0x2a,id);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(char *)local_1e8._0_8_,local_1e8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        if ((cmState *)local_1e8._0_8_ != (cmState *)(local_1e8 + 0x10)) {
          operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"MACOSX_RPATH is not specified for the following targets:\n"
                   ,0x39);
        p_Var8 = (this->CMP0042WarnTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var1 = &(this->CMP0042WarnTargets)._M_t._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)p_Var8 != p_Var1) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,*(char **)(p_Var8 + 1),
                                (long)p_Var8[1]._M_parent);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
            p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
          } while ((_Rb_tree_header *)p_Var8 != p_Var1);
        }
        pcVar2 = this->CMakeInstance;
        std::__cxx11::stringbuf::str();
        cmListFileBacktrace::cmListFileBacktrace(&local_1c8);
        cmake::IssueMessage(pcVar2,AUTHOR_WARNING,(string *)local_1e8,&local_1c8);
        cmListFileBacktrace::~cmListFileBacktrace(&local_1c8);
        if ((cmState *)local_1e8._0_8_ != (cmState *)(local_1e8 + 0x10)) {
          operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
      }
      if ((this->CMP0068WarnTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        cmPolicies::GetPolicyWarning_abi_cxx11_((string *)local_1e8,(cmPolicies *)0x44,id_00);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(char *)local_1e8._0_8_,local_1e8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,
                   "\nFor compatibility with older versions of CMake, the install_name fields for the following targets are still affected by RPATH settings:\n"
                   ,0x89);
        if ((cmState *)local_1e8._0_8_ != (cmState *)(local_1e8 + 0x10)) {
          operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
        }
        p_Var8 = (this->CMP0068WarnTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var1 = &(this->CMP0068WarnTargets)._M_t._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)p_Var8 != p_Var1) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,*(char **)(p_Var8 + 1),
                                (long)p_Var8[1]._M_parent);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
            p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
          } while ((_Rb_tree_header *)p_Var8 != p_Var1);
        }
        pcVar2 = this->CMakeInstance;
        std::__cxx11::stringbuf::str();
        cmListFileBacktrace::cmListFileBacktrace(&local_1c8);
        cmake::IssueMessage(pcVar2,AUTHOR_WARNING,(string *)local_1e8,&local_1c8);
        cmListFileBacktrace::~cmListFileBacktrace(&local_1c8);
        if ((cmState *)local_1e8._0_8_ != (cmState *)(local_1e8 + 0x10)) {
          operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
      }
      cmake::UpdateProgress(this->CMakeInstance,"Generating done",-1.0);
      return;
    }
    bVar4 = cmExportFileGenerator::GenerateImportFile(*(cmExportFileGenerator **)(p_Var6 + 2));
    if (!bVar4) {
      if (((cmSystemTools::s_ErrorOccured == false) && (cmSystemTools::s_FatalErrorOccured == false)
          ) && (bVar4 = cmSystemTools::GetInterruptFlag(), !bVar4)) {
        pcVar2 = this->CMakeInstance;
        local_1a8._0_8_ = local_1a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"Could not write export file.","");
        cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)local_1e8);
        cmake::IssueMessage(pcVar2,FATAL_ERROR,(string *)local_1a8,(cmListFileBacktrace *)local_1e8)
        ;
        cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_1e8);
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
      }
      if (bVar3) {
        return;
      }
      goto LAB_0033a217;
    }
    p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
  } while( true );
}

Assistant:

void cmGlobalGenerator::Generate()
{
  // Create a map from local generator to the complete set of targets
  // it builds by default.
  this->InitializeProgressMarks();

  this->ProcessEvaluationFiles();

  // Generate project files
  for (unsigned int i = 0; i < this->LocalGenerators.size(); ++i) {
    this->SetCurrentMakefile(this->LocalGenerators[i]->GetMakefile());
    this->LocalGenerators[i]->Generate();
    if (!this->LocalGenerators[i]->GetMakefile()->IsOn(
          "CMAKE_SKIP_INSTALL_RULES")) {
      this->LocalGenerators[i]->GenerateInstallRules();
    }
    this->LocalGenerators[i]->GenerateTestFiles();
    this->CMakeInstance->UpdateProgress(
      "Generating", (static_cast<float>(i) + 1.0f) /
        static_cast<float>(this->LocalGenerators.size()));
  }
  this->SetCurrentMakefile(CM_NULLPTR);

  if (!this->GenerateCPackPropertiesFile()) {
    this->GetCMakeInstance()->IssueMessage(
      cmake::FATAL_ERROR, "Could not write CPack properties file.");
  }

  for (std::map<std::string, cmExportBuildFileGenerator*>::iterator it =
         this->BuildExportSets.begin();
       it != this->BuildExportSets.end(); ++it) {
    if (!it->second->GenerateImportFile()) {
      if (!cmSystemTools::GetErrorOccuredFlag()) {
        this->GetCMakeInstance()->IssueMessage(cmake::FATAL_ERROR,
                                               "Could not write export file.");
      }
      return;
    }
  }
  // Update rule hashes.
  this->CheckRuleHashes();

  this->WriteSummary();

  if (this->ExtraGenerator != CM_NULLPTR) {
    this->ExtraGenerator->Generate();
  }

  if (!this->CMP0042WarnTargets.empty()) {
    std::ostringstream w;
    w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0042) << "\n";
    w << "MACOSX_RPATH is not specified for"
         " the following targets:\n";
    for (std::set<std::string>::iterator iter =
           this->CMP0042WarnTargets.begin();
         iter != this->CMP0042WarnTargets.end(); ++iter) {
      w << " " << *iter << "\n";
    }
    this->GetCMakeInstance()->IssueMessage(cmake::AUTHOR_WARNING, w.str());
  }

  if (!this->CMP0068WarnTargets.empty()) {
    std::ostringstream w;
    /* clang-format off */
    w <<
      cmPolicies::GetPolicyWarning(cmPolicies::CMP0068) << "\n"
      "For compatibility with older versions of CMake, the install_name "
      "fields for the following targets are still affected by RPATH "
      "settings:\n"
      ;
    /* clang-format on */
    for (std::set<std::string>::iterator iter =
           this->CMP0068WarnTargets.begin();
         iter != this->CMP0068WarnTargets.end(); ++iter) {
      w << " " << *iter << "\n";
    }
    this->GetCMakeInstance()->IssueMessage(cmake::AUTHOR_WARNING, w.str());
  }

  this->CMakeInstance->UpdateProgress("Generating done", -1);
}